

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O0

void __thiscall
libtest::printer::format_rec<char_const*>(printer *this,string *s,usize index,char **t)

{
  ostream *poVar1;
  char **ppcVar2;
  char *pcVar3;
  ulong uVar4;
  char **t_local;
  usize index_local;
  string *s_local;
  printer *this_local;
  
  t_local = (char **)index;
  while( true ) {
    while( true ) {
      ppcVar2 = (char **)std::__cxx11::string::size();
      if (ppcVar2 <= t_local) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/pachicobue[P]libtest/a_plus_b/../utils/printer.hpp"
                      ,0x3f,
                      "void libtest::printer::format_rec(const std::string &, usize, const T &, const Args...) [T = const char *, Args = <>]"
                     );
      }
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      if (*pcVar3 == '%') break;
      poVar1 = this->os;
      t_local = (char **)((long)t_local + 1);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      std::operator<<(poVar1,*pcVar3);
    }
    uVar4 = std::__cxx11::string::size();
    if ((uVar4 <= (long)t_local + 1U) ||
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar3 != '%')) break;
    t_local = (char **)((long)t_local + 2);
    std::operator<<(this->os,'%');
  }
  std::operator<<(this->os,*t);
  format_rec(this,s,(long)t_local + 1);
  return;
}

Assistant:

void format_rec(const std::string& s, usize index, const T& t, const Args... args)
    {
        for (; index < s.size();) {
            if (s[index] == '%') {
                if (index + 1 < s.size() and s[index + 1] == '%') {
                    index += 2, os << '%';
                } else {
                    return os << t, format_rec(s, ++index, args...), static_cast<void>(0);
                }
            } else {
                os << s[index++];
            }
        }
        assert(false);
    }